

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

void __thiscall
Fixpp::impl::
MessageVisitor<should_visit_custom_message::Visitor,should_visit_custom_message::MyVisitRules>::
handleUnknownTag<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)76>,Fixpp::Required<Fixpp::TagT<66u,Fixpp::Type::String>>,Fixpp::TagT<391u,Fixpp::Type::String>,Fixpp::TagT<390u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::TypedParsingContext<void>>
          (MessageVisitor<should_visit_custom_message::Visitor,should_visit_custom_message::MyVisitRules>
           *this,Token *valueToken,TypedParsingContext<void> *message,undefined8 param_3,int tag)

{
  pair<const_char_*,_unsigned_long> local_48;
  int local_34;
  undefined8 uStack_30;
  int tag_local;
  TypedParsingContext<void> *param_3_local;
  VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_L_>,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::TagT<391U,_Fixpp::Type::String>,_Fixpp::TagT<390U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  *message_local;
  Token *valueToken_local;
  MessageVisitor<should_visit_custom_message::Visitor,_should_visit_custom_message::MyVisitRules>
  *this_local;
  
  local_34 = tag;
  uStack_30 = param_3;
  param_3_local = message;
  message_local =
       (VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_L_>,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::TagT<391U,_Fixpp::Type::String>,_Fixpp::TagT<390U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
        *)valueToken;
  valueToken_local = (Token *)this;
  local_48 = StreamCursor::Token::view(valueToken);
  llvm::
  SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::Required<Fixpp::TagT<66u,Fixpp::Type::String>>,Fixpp::TagT<391u,Fixpp::Type::String>,Fixpp::TagT<390u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>::Unparsed>
  ::emplace_back<int&,std::pair<char_const*,unsigned_long>>
            ((SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,Fixpp::Required<Fixpp::TagT<66u,Fixpp::Type::String>>,Fixpp::TagT<391u,Fixpp::Type::String>,Fixpp::TagT<390u,Fixpp::Type::String>,Fixpp::Required<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>::Unparsed>
              *)(message[1].super_ParsingContext.error.storage_.__data + 8),&local_34,&local_48);
  return;
}

Assistant:

void handleUnknownTag(const StreamCursor::Token& valueToken, Message& message, Context& /*context*/, int tag,
                                  BoolPack<false, false>)
            {
                message.unparsed.emplace_back(tag, valueToken.view());
            }